

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencl.cpp
# Opt level: O0

void __thiscall indk::ComputeBackendOpenCL::doWaitTarget(ComputeBackendOpenCL *this)

{
  ComputeBackendOpenCL *this_local;
  
  return;
}

Assistant:

void indk::ComputeBackendOpenCL::doWaitTarget() {
#ifdef INDK_OPENCL_SUPPORT
    uint64_t x = 0;
    for (const auto &o: Objects) {
        auto n = (indk::Neuron*)o;
        auto state = n->getState(n->getTime());
        auto ec = n -> getEntriesCount();

        for (int j = 0; j < ec; j++) {
            auto e = n -> getEntry(j);
            if (state == indk::Neuron::States::Pending) {
                Inputs[x] = {
                        static_cast<cl_float>(1),
                        static_cast<cl_float>(e->getIn()),
                };
            } else {
                Inputs[x] = {
                        static_cast<cl_float>(0),
                        static_cast<cl_float>(0),
                };
            }
            x++;
        }
    }

    Queue.enqueueWriteBuffer(InputsBuffer, CL_TRUE, 0, sizeof(cl_float2)*InputPoolSize, Inputs);

    Queue.enqueueNDRangeKernel(KernelPairs, cl::NullRange, cl::NDRange(PairPoolSize), cl::NullRange);
    Queue.finish();
    Queue.enqueueNDRangeKernel(KernelReceptors, cl::NullRange, cl::NDRange(ReceptorPoolSize), cl::NullRange);
    Queue.finish();
    Queue.enqueueNDRangeKernel(KernelNeurons, cl::NullRange, cl::NDRange(NeuronPoolSize), cl::NullRange);
    Queue.finish();

    Queue.enqueueReadBuffer(OutputsBuffer, CL_TRUE, 0, sizeof(cl_float)*NeuronPoolSize, Outputs);

    for (int ni = 0; ni < Objects.size(); ni++) {
        if (Inputs[(int)NeuronsInfo[ni].s2].s0 == 0) {
            continue;
        }
        auto n = (indk::Neuron*)Objects[ni];
        n -> doFinalizeInput(Outputs[ni]);
    }
#endif
}